

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<pstore::chunked_sequence<int,2ul,4ul,4ul>,void>
               (chunked_sequence<int,_2UL,_4UL,_4UL> *container,ostream *os)

{
  bool bVar1;
  int *piVar2;
  long lVar3;
  list_iterator lVar4;
  _List_node_base *p_Var5;
  const_iterator cVar6;
  iterator_base<true> iVar7;
  char local_45 [5];
  _List_node_base *local_40;
  list_iterator local_38;
  
  local_45[2] = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_45 + 2,1);
  cVar6 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::begin(container);
  iVar7 = pstore::chunked_sequence<int,2ul,4ul,4ul>::
          end_impl<pstore::chunked_sequence<int,2ul,4ul,4ul>const,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<true>>
                    (container);
  if (SUB168((undefined1  [16])cVar6 ^ (undefined1  [16])iVar7,8) != 0 ||
      SUB168((undefined1  [16])cVar6 ^ (undefined1  [16])iVar7,0) != 0) {
    lVar3 = 0;
    do {
      local_40 = (_List_node_base *)iVar7.index_;
      local_38 = iVar7.chunk_it_._M_node;
      lVar4 = cVar6.chunk_it_._M_node;
      piVar2 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::operator[]
                         ((chunk *)(lVar4._M_node + 1),cVar6.index_);
      if (lVar3 == 0) {
LAB_00159411:
        local_45[1] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(os,local_45 + 1,1);
        std::ostream::operator<<((ostream *)os,*piVar2);
        lVar3 = lVar3 + 1;
        bVar1 = true;
      }
      else {
        local_45[0] = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,local_45,1);
        if (lVar3 != 0x20) goto LAB_00159411;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar1 = false;
      }
      iVar7.index_ = (size_t)local_40;
      iVar7.chunk_it_._M_node = local_38._M_node;
      if (!bVar1) break;
      p_Var5 = (_List_node_base *)(cVar6.index_ + 1);
      if (lVar4._M_node[1]._M_next <= p_Var5) {
        lVar4._M_node = (lVar4._M_node)->_M_next;
        p_Var5 = (_List_node_base *)0x0;
      }
      cVar6.index_ = (size_t)p_Var5;
      cVar6.chunk_it_._M_node = lVar4._M_node;
    } while (p_Var5 != local_40 || lVar4._M_node != local_38._M_node);
    if (lVar3 != 0) {
      local_45[3] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_45 + 3,1);
      iVar7.index_ = (size_t)local_40;
      iVar7.chunk_it_._M_node = local_38._M_node;
    }
  }
  local_40 = (_List_node_base *)iVar7.index_;
  local_38 = iVar7.chunk_it_._M_node;
  local_45[4] = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_45 + 4,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }